

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  BrotliHasherParams *pBVar1;
  MemoryManager *m;
  Hasher *hasher;
  size_t *last_insert_len;
  size_t *num_literals;
  int *piVar2;
  uint32_t *puVar3;
  uint8_t prev_byte;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *data;
  uint16_t *puVar8;
  HasherCommon *pHVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  size_t num_commands;
  BrotliEncoderParams *pBVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ushort uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint32_t *buckets_2;
  uint32_t *puVar23;
  uint8_t *puVar24;
  int *piVar25;
  ulong uVar26;
  Command *pCVar27;
  void *pvVar28;
  byte bVar30;
  char cVar31;
  uint uVar32;
  uint16_t uVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  size_t sVar38;
  ContextLut literal_context_lut;
  uint8_t uVar39;
  undefined1 *puVar40;
  size_t *psVar41;
  uint32_t uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  uint32_t result;
  uint uVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  uint uVar50;
  ulong mask;
  ulong uVar51;
  undefined1 *puVar52;
  size_t *psVar53;
  bool bVar54;
  bool bVar55;
  ulong local_260;
  ulong local_248;
  size_t storage_ix_1;
  ulong local_228;
  size_t *local_220;
  ulong local_218;
  BlockSplitFromDecoder *local_210;
  BlockSplitFromDecoder *local_208;
  ulong local_200;
  int *local_1f8;
  undefined1 *local_1f0;
  uint8_t *local_1e8;
  size_t *local_1e0;
  size_t *local_1d8;
  uint8_t **local_1d0;
  ContextLut local_1c8;
  HasherCommon *local_1c0;
  uint32_t *local_1b8;
  size_t num_literal_contexts;
  uint32_t *local_1a8;
  size_t storage_ix;
  BlockSplit local_170;
  BlockSplit local_140;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  size_t table_size;
  uint32_t local_74;
  void *pvVar29;
  
  uVar26 = s->last_processed_pos_;
  uVar46 = (uint)uVar26;
  psVar53 = (size_t *)(uVar26 & 0xffffffff);
  if (2 < uVar26 >> 0x1e) {
    psVar53 = (size_t *)
              (ulong)(((int)(uVar46 * 2) >> 1 & 0xc0000000U) + (uVar46 & 0x3fffffff) + 0x80000000);
  }
  uVar32 = (uint)psVar53;
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  local_200 = s->input_pos_;
  local_260 = local_200 - uVar26;
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < local_260) {
    return 0;
  }
  local_218 = CONCAT44(local_218._4_4_,force_flush);
  uVar5 = (s->ringbuffer_).mask_;
  mask = (ulong)uVar5;
  m = &s->memory_manager_;
  data = (s->ringbuffer_).buffer_;
  uVar35 = (s->params).quality;
  uVar7 = (uint)local_260;
  local_1e0 = out_size;
  local_1d0 = output;
  if (uVar35 == 1) {
    if (s->command_buf_ == (uint32_t *)0x0) {
      puVar23 = (uint32_t *)BrotliAllocate(m,0x80000);
      s->command_buf_ = puVar23;
      puVar24 = (uint8_t *)BrotliAllocate(m,0x20000);
      s->literal_buf_ = puVar24;
      uVar35 = (s->params).quality;
      goto LAB_0012fd2d;
    }
LAB_0012fd36:
    storage_ix = (size_t)s->last_bytes_bits_;
    if (is_last == 0 && local_200 == uVar26) {
      sVar38 = 0;
    }
    else {
      puVar24 = GetBrotliStorage(s,(ulong)(uVar7 * 2 + 0x1f7));
      *puVar24 = (uint8_t)s->last_bytes_;
      puVar24[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
      local_260 = local_260 & 0xffffffff;
      piVar25 = GetHashTable(s,(s->params).quality,local_260,&table_size);
      if ((s->params).quality == 0) {
        BrotliCompressFragmentFast
                  (m,data + (uVar5 & uVar32),local_260,is_last,piVar25,table_size,s->cmd_depths_,
                   s->cmd_bits_,&s->cmd_code_numbits_,s->cmd_code_,&storage_ix,puVar24);
      }
      else {
        BrotliCompressFragmentTwoPass
                  (m,data + (uVar5 & uVar32),local_260,is_last,s->command_buf_,s->literal_buf_,
                   piVar25,table_size,&storage_ix,puVar24);
      }
      sVar38 = storage_ix >> 3;
      s->last_bytes_ = (ushort)puVar24[sVar38];
      s->last_bytes_bits_ = (byte)storage_ix & 7;
      UpdateLastProcessedPos(s);
      *local_1d0 = puVar24;
    }
    goto LAB_00132194;
  }
LAB_0012fd2d:
  if (uVar35 < 2) goto LAB_0012fd36;
  uVar26 = s->num_commands_ + (local_260 >> 1 & 0x7fffffff) + 1;
  if (s->cmd_alloc_size_ < uVar26) {
    sVar38 = (local_260 >> 2 & 0x3fffffff) + uVar26 + 0x10;
    s->cmd_alloc_size_ = sVar38;
    if (sVar38 == 0) {
      pCVar27 = (Command *)0x0;
    }
    else {
      pCVar27 = (Command *)BrotliAllocate(m,sVar38 * 0x10);
    }
    if (s->commands_ != (Command *)0x0) {
      memcpy(pCVar27,s->commands_,s->num_commands_ << 4);
      BrotliFree(m,s->commands_);
    }
    s->commands_ = pCVar27;
  }
  bVar54 = is_last != 0;
  hasher = &s->hasher_;
  uVar26 = local_260 & 0xffffffff;
  bVar55 = uVar32 == 0;
  local_220 = psVar53;
  if ((s->hasher_).common.extra != (void *)0x0) {
    local_1f8 = &(s->hasher_).common.is_prepared_;
    if ((s->hasher_).common.is_prepared_ == 0) goto LAB_00130415;
    goto LAB_001306ba;
  }
  pBVar1 = &(s->params).hasher;
  uVar35 = (s->params).quality;
  if ((int)uVar35 < 10) {
    uVar37 = uVar35;
    if (uVar35 == 4) {
      if (0xfffff < (s->params).size_hint) {
        pBVar1->type = 0x36;
        uVar37 = 0x36;
        goto LAB_00130009;
      }
    }
    else if (4 < (int)uVar35) {
      uVar37 = (s->params).lgwin;
      if (0x10 < (int)uVar37) {
        if ((uVar37 < 0x13) || ((s->params).size_hint < 0x100000)) {
          iVar22 = 0x10;
          if (uVar35 < 9) {
            iVar22 = 10;
          }
          (s->params).hasher.type = 5;
          (s->params).hasher.block_bits = uVar35 - 1;
          (s->params).hasher.bucket_bits = 0xf - (uint)(uVar35 < 7);
          iVar21 = 4;
          if (6 < uVar35) {
            iVar21 = iVar22;
          }
          (s->params).hasher.num_last_distances_to_check = iVar21;
          uVar37 = 5;
        }
        else {
          (s->params).hasher.type = 6;
          (s->params).hasher.bucket_bits = 0xf;
          (s->params).hasher.block_bits = uVar35 - 1;
          (s->params).hasher.hash_len = 5;
          iVar22 = 0x10;
          if (uVar35 < 9) {
            iVar22 = 10;
          }
          iVar21 = 4;
          if (6 < uVar35) {
            iVar21 = iVar22;
          }
          (s->params).hasher.num_last_distances_to_check = iVar21;
          uVar37 = 6;
        }
        goto LAB_00130009;
      }
      uVar37 = 0x28;
      if (6 < uVar35) {
        uVar37 = 0x2a - (uVar35 < 9);
      }
    }
    pBVar1->type = uVar37;
  }
  else {
    pBVar1->type = 10;
    uVar37 = 10;
  }
LAB_00130009:
  iVar22 = (s->params).lgwin;
  pvVar29 = (void *)0x0;
  pvVar28 = (void *)0x0;
  if (iVar22 < 0x19) {
    switch(uVar37 - 2) {
    case 0:
    case 1:
      goto switchD_0013002b_caseD_0;
    case 2:
      goto switchD_0013002b_caseD_2;
    case 3:
    case 4:
      goto switchD_0013002b_caseD_3;
    case 5:
    case 6:
    case 7:
      break;
    case 8:
      goto switchD_0013002b_caseD_8;
    default:
      switch(uVar37) {
      case 0x23:
        goto switchD_00130071_caseD_23;
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        break;
      case 0x28:
      case 0x29:
        goto switchD_0013002b_caseD_2;
      case 0x2a:
        goto switchD_00130071_caseD_2a;
      default:
        if (uVar37 == 0x36) {
          sVar38 = 0x400000;
          goto LAB_001301af;
        }
      }
    }
    goto switchD_0013002b_caseD_5;
  }
  pvVar28 = pvVar29;
  switch(uVar37 - 2) {
  case 0:
switchD_0013002b_caseD_0:
    sVar38 = 0x40000;
    break;
  case 1:
    pBVar1->type = 0x23;
switchD_00130071_caseD_23:
    sVar38 = 0x4040000;
    break;
  case 2:
switchD_0013002b_caseD_2:
    sVar38 = 0x80000;
    break;
  case 3:
switchD_0013002b_caseD_3:
    bVar30 = (byte)(s->params).hasher.bucket_bits;
    sVar38 = ((4L << (bVar30 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f)) +
             (2L << (bVar30 & 0x3f));
    goto LAB_001301a6;
  case 4:
    (s->params).hasher.type = 0x41;
    bVar30 = (byte)(s->params).hasher.bucket_bits;
    sVar38 = ((4L << (bVar30 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f)) +
             (2L << (bVar30 & 0x3f)) + 0x4000000;
    goto LAB_001301a6;
  case 5:
  case 6:
  case 7:
    goto switchD_0013002b_caseD_5;
  case 8:
switchD_0013002b_caseD_8:
    uVar45 = 1L << ((byte)iVar22 & 0x3f);
    uVar51 = uVar26;
    if (uVar45 < uVar26) {
      uVar51 = uVar45;
    }
    if (!bVar55 || !bVar54) {
      uVar51 = uVar45;
    }
    sVar38 = uVar51 * 8 + 0x80000;
LAB_001301a6:
    if (sVar38 != 0) break;
    pvVar28 = (void *)0x0;
    goto switchD_0013002b_caseD_5;
  default:
    switch(uVar37) {
    case 0x23:
      goto switchD_00130071_caseD_23;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
    case 0x29:
      goto switchD_0013002b_caseD_2;
    case 0x2a:
switchD_00130071_caseD_2a:
      sVar38 = 0x140000;
      goto LAB_001301af;
    default:
      if (uVar37 == 0x36) {
        pBVar1->type = 0x37;
        sVar38 = 0x4400000;
        goto LAB_001301af;
      }
    }
    goto switchD_0013002b_caseD_5;
  }
LAB_001301af:
  pvVar28 = BrotliAllocate(m,sVar38);
switchD_0013002b_caseD_5:
  (s->hasher_).common.extra = pvVar28;
  iVar22 = pBVar1->bucket_bits;
  iVar21 = (s->params).hasher.block_bits;
  iVar19 = (s->params).hasher.hash_len;
  (s->hasher_).common.params.type = pBVar1->type;
  (s->hasher_).common.params.bucket_bits = iVar22;
  (s->hasher_).common.params.block_bits = iVar21;
  (s->hasher_).common.params.hash_len = iVar19;
  (s->hasher_).common.params.num_last_distances_to_check =
       (s->params).hasher.num_last_distances_to_check;
  iVar22 = (s->hasher_).common.params.type;
  if (iVar22 < 0x23) {
    switch(iVar22) {
    case 2:
    case 3:
    case 4:
switchD_00130275_caseD_2:
      (s->hasher_).privat._H2.common = &hasher->common;
LAB_00130307:
      (s->hasher_).privat._H5.block_size_ = (size_t)pvVar28;
      break;
    case 5:
      InitializeH5(&hasher->common,&(s->hasher_).privat._H5,
                   (BrotliEncoderParams *)&switchD_00130275::switchdataD_0015c130);
      break;
    case 6:
      InitializeH6(&hasher->common,&(s->hasher_).privat._H6,
                   (BrotliEncoderParams *)&switchD_00130275::switchdataD_0015c130);
      break;
    case 10:
      iVar22 = (s->params).lgwin;
      (s->hasher_).privat._H5.block_size_ = (size_t)pvVar28;
      (s->hasher_).privat._H40.common = (HasherCommon *)((long)pvVar28 + 0x80000);
      uVar35 = -1 << ((byte)iVar22 & 0x1f);
      *(ulong *)&(s->hasher_).privat = (ulong)~uVar35;
      (s->hasher_).privat._H5.hash_shift_ = uVar35 + 1;
    }
  }
  else if (iVar22 < 0x36) {
    switch(iVar22) {
    case 0x23:
switchD_0013022d_caseD_23:
      (s->hasher_).privat._H35.common = &hasher->common;
      (s->hasher_).privat._H35.extra = pvVar28;
      puVar23 = (uint32_t *)(s->hasher_).common.dict_num_lookups;
      sVar38 = (s->hasher_).common.dict_num_matches;
      iVar22 = (s->hasher_).common.params.type;
      iVar21 = (s->hasher_).common.params.bucket_bits;
      iVar19 = (s->hasher_).common.params.block_bits;
      iVar20 = (s->hasher_).common.params.hash_len;
      uVar13 = *(undefined8 *)&(s->hasher_).common.params.num_last_distances_to_check;
      (s->hasher_).privat._H6.num_ = (uint16_t *)(hasher->common).extra;
      (s->hasher_).privat._H6.buckets_ = puVar23;
      (s->hasher_).privat._H35.hb_common.dict_num_matches = sVar38;
      *(int *)((long)&(s->hasher_).privat + 0x50) = iVar22;
      *(int *)((long)&(s->hasher_).privat + 0x54) = iVar21;
      *(int *)((long)&(s->hasher_).privat + 0x58) = iVar19;
      *(int *)((long)&(s->hasher_).privat + 0x5c) = iVar20;
      *(undefined8 *)&(s->hasher_).privat._H35.hb_common.params.num_last_distances_to_check = uVar13
      ;
      (s->hasher_).privat._H35.fresh = 1;
      (s->hasher_).privat._H35.params = &s->params;
      break;
    case 0x28:
    case 0x29:
      iVar22 = (s->params).quality;
      (s->hasher_).privat._H40.common = &hasher->common;
      *(void **)&(s->hasher_).privat._H65.ha.hash_shift_ = pvVar28;
      pvVar28 = (void *)(ulong)((iVar22 < 7) + 7 << ((char)iVar22 - 4U & 0x1f));
      goto LAB_00130307;
    case 0x2a:
      iVar22 = (s->params).quality;
      (s->hasher_).privat._H42.common = &hasher->common;
      (s->hasher_).privat._H42.extra = pvVar28;
      *(ulong *)((long)&(s->hasher_).privat + 0x400) =
           (ulong)((iVar22 < 7) + 7 << ((char)iVar22 - 4U & 0x1f));
    }
  }
  else {
    if (iVar22 == 0x36) goto switchD_00130275_caseD_2;
    if (iVar22 == 0x37) goto switchD_0013022d_caseD_23;
    if (iVar22 == 0x41) {
      (s->hasher_).privat._H65.common = &hasher->common;
      (s->hasher_).privat._H65.extra = pvVar28;
      sVar38 = (s->hasher_).common.dict_num_lookups;
      pBVar12 = (BrotliEncoderParams *)(s->hasher_).common.dict_num_matches;
      iVar22 = (s->hasher_).common.params.type;
      iVar21 = (s->hasher_).common.params.bucket_bits;
      iVar19 = (s->hasher_).common.params.block_bits;
      iVar20 = (s->hasher_).common.params.hash_len;
      uVar13 = *(undefined8 *)&(s->hasher_).common.params.num_last_distances_to_check;
      (s->hasher_).privat._H35.common = (HasherCommon *)(hasher->common).extra;
      (s->hasher_).privat._H65.hb_common.dict_num_lookups = sVar38;
      (s->hasher_).privat._H35.params = pBVar12;
      *(int *)((long)&(s->hasher_).privat + 0x88) = iVar22;
      *(int *)((long)&(s->hasher_).privat + 0x8c) = iVar21;
      *(int *)((long)&(s->hasher_).privat + 0x90) = iVar19;
      *(int *)((long)&(s->hasher_).privat + 0x94) = iVar20;
      *(undefined8 *)&(s->hasher_).privat._H65.hb_common.params.num_last_distances_to_check = uVar13
      ;
      (s->hasher_).privat._H65.fresh = 1;
      (s->hasher_).privat._H65.params = &s->params;
    }
  }
  (s->hasher_).common.is_prepared_ = 0;
LAB_00130415:
  local_1f8 = &(s->hasher_).common.is_prepared_;
  iVar22 = (s->hasher_).common.params.type;
  uVar35 = (uint)(bVar55 && bVar54);
  if (0x22 < iVar22) {
    if (iVar22 < 0x36) {
      if (iVar22 - 0x23U < 8) {
        uVar35 = (uint)(bVar55 && bVar54);
        switch(iVar22) {
        case 0x23:
          PrepareH35(&(s->hasher_).privat._H35,uVar35,uVar26,data);
          break;
        case 0x28:
          PrepareH40(&(s->hasher_).privat._H40,uVar35,uVar26,data);
          break;
        case 0x29:
          PrepareH41(&(s->hasher_).privat._H41,uVar35,uVar26,data);
          break;
        case 0x2a:
          PrepareH42(&(s->hasher_).privat._H42,uVar35,uVar26,data);
        }
      }
    }
    else if (iVar22 == 0x36) {
      PrepareH54((H54 *)(s->hasher_).privat._H35.ha.buckets_,uVar35,uVar26,data);
    }
    else if (iVar22 == 0x37) {
      PrepareH55(&(s->hasher_).privat._H55,uVar35,uVar26,data);
    }
    else if (iVar22 == 0x41) {
      PrepareH65(&(s->hasher_).privat._H65,uVar35,uVar26,data);
    }
    goto switchD_00130444_caseD_24;
  }
  switch(iVar22) {
  case 2:
    puVar23 = (s->hasher_).privat._H2.buckets_;
    if ((0x800 < uVar7) || (!bVar55 || !bVar54)) {
LAB_00130580:
      memset(puVar23,0,0x40000);
      break;
    }
    if (uVar26 != 0) {
      uVar51 = 0;
      do {
        puVar23[(ulong)(*(long *)(data + uVar51) * -0x42e1ca5843000000) >> 0x30] = 0;
        uVar51 = uVar51 + 1;
      } while (uVar26 != uVar51);
      break;
    }
    goto LAB_0013069f;
  case 3:
    puVar23 = (s->hasher_).privat._H2.buckets_;
    if ((0x800 < uVar7) || (!bVar55 || !bVar54)) goto LAB_00130580;
    if (uVar26 == 0) goto LAB_0013069f;
    uVar51 = 0;
    do {
      lVar36 = *(long *)(data + uVar51);
      puVar23[(ulong)(lVar36 * -0x42e1ca5843000000) >> 0x30] = 0;
      puVar23[(ushort)((ulong)(lVar36 * -0x42e1ca5843000000) >> 0x30) + 8 & 0xffff] = 0;
      uVar51 = uVar51 + 1;
    } while (uVar26 != uVar51);
    break;
  case 4:
    PrepareH4((H4 *)(s->hasher_).privat._H35.ha.buckets_,uVar35,uVar26,data);
    break;
  case 5:
    PrepareH5(&(s->hasher_).privat._H5,uVar35,uVar26,data);
    break;
  case 6:
    PrepareH6(&(s->hasher_).privat._H6,uVar35,uVar26,data);
    break;
  case 10:
    puVar23 = (s->hasher_).privat._H2.buckets_;
    uVar42 = (s->hasher_).privat._H5.hash_shift_;
    lVar36 = 0;
    do {
      puVar3 = puVar23 + lVar36;
      *puVar3 = uVar42;
      puVar3[1] = uVar42;
      puVar3[2] = uVar42;
      puVar3[3] = uVar42;
      lVar36 = lVar36 + 4;
    } while (lVar36 != 0x20000);
  }
switchD_00130444_caseD_24:
  if (uVar32 == 0) {
LAB_0013069f:
    (s->hasher_).common.dict_num_lookups = 0;
    (s->hasher_).common.dict_num_matches = 0;
  }
  *local_1f8 = 1;
LAB_001306ba:
  iVar22 = (s->hasher_).common.params.type;
  uVar35 = (uint)local_220;
  if (iVar22 < 0x23) {
    switch(iVar22) {
    case 2:
      if ((6 < uVar7) && (2 < uVar32)) {
        puVar23 = (s->hasher_).privat._H2.buckets_;
        puVar23[(ulong)(*(long *)(data + (uVar35 - 3 & uVar5)) * -0x42e1ca5843000000) >> 0x30] =
             uVar35 - 3;
        puVar23[(ulong)(*(long *)(data + (uVar35 - 2 & uVar5)) * -0x42e1ca5843000000) >> 0x30] =
             uVar35 - 2;
        puVar23[(ulong)(*(long *)(data + (uVar35 - 1 & uVar5)) * -0x42e1ca5843000000) >> 0x30] =
             uVar35 - 1;
      }
      break;
    case 3:
      if ((6 < uVar7) && (2 < uVar32)) {
        uVar37 = uVar35 - 3;
        puVar23 = (s->hasher_).privat._H2.buckets_;
        uVar34 = 0xffff;
        puVar23[(uint)(ushort)((ulong)(*(long *)(data + (uVar37 & uVar5)) * -0x42e1ca5843000000) >>
                              0x30) + (uVar37 & 8) & 0xffff] = uVar37;
        uVar37 = uVar35 - 2;
        puVar23[(uint)(ushort)((ulong)(*(long *)(data + (uVar37 & uVar5)) * -0x42e1ca5843000000) >>
                              0x30) + (uVar37 & 8) & 0xffff] = uVar37;
        uVar37 = (uint)(ushort)((ulong)(*(long *)(data + (uVar35 - 1 & uVar5)) * -0x42e1ca5843000000
                                       ) >> 0x30);
        uVar50 = uVar35 - 1 & 8;
LAB_001313d8:
        puVar23[uVar37 + uVar50 & uVar34] = uVar35 - 1;
      }
      break;
    case 4:
      if ((6 < uVar7) && (2 < uVar32)) {
        uVar37 = uVar35 - 3;
        puVar23 = (s->hasher_).privat._H2.buckets_;
        uVar34 = 0x1ffff;
        puVar23[(uint)((ulong)(*(long *)(data + (uVar37 & uVar5)) * -0x42e1ca5843000000) >> 0x2f) +
                (uVar37 & 0x18) & 0x1ffff] = uVar37;
        uVar37 = uVar35 - 2;
        puVar23[(uint)((ulong)(*(long *)(data + (uVar37 & uVar5)) * -0x42e1ca5843000000) >> 0x2f) +
                (uVar37 & 0x18) & 0x1ffff] = uVar37;
        uVar37 = (uint)((ulong)(*(long *)(data + (uVar35 - 1 & uVar5)) * -0x42e1ca5843000000) >>
                       0x2f);
LAB_001313d3:
        uVar50 = uVar35 - 1 & 0x18;
        goto LAB_001313d8;
      }
      break;
    case 5:
      if ((2 < uVar7) && (2 < uVar32)) {
        uVar37 = (uint)(*(int *)(data + (uVar35 - 3 & uVar5)) * 0x1e35a7bd) >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
        puVar8 = (s->hasher_).privat._H5.num_;
        uVar4 = puVar8[uVar37];
        puVar23 = (s->hasher_).privat._H5.buckets_;
        puVar23[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar4) +
                (ulong)(uVar37 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] =
             uVar35 - 3;
        puVar8[uVar37] = uVar4 + 1;
        uVar37 = (uint)(*(int *)(data + (uVar35 - 2 & uVar5)) * 0x1e35a7bd) >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
        uVar4 = puVar8[uVar37];
        puVar23[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar4) +
                (ulong)(uVar37 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] =
             uVar35 - 2;
        puVar8[uVar37] = uVar4 + 1;
        uVar37 = (uint)(*(int *)(data + (uVar35 - 1 & uVar5)) * 0x1e35a7bd) >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
        uVar4 = puVar8[uVar37];
        puVar23[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar4) +
                (ulong)(uVar37 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] =
             uVar35 - 1;
        puVar8[uVar37] = uVar4 + 1;
      }
      break;
    case 6:
      if ((6 < uVar7) && (2 < uVar32)) {
        uVar26 = (s->hasher_).privat._H6.hash_mask_;
        uVar51 = (*(ulong *)(data + (uVar35 - 3 & uVar5)) & uVar26) * 0x1fe35a7bd3579bd3 >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
        puVar8 = (s->hasher_).privat._H6.num_;
        puVar23 = (s->hasher_).privat._H6.buckets_;
        uVar45 = uVar51 & 0xffffffff;
        uVar4 = puVar8[uVar45];
        uVar37 = (s->hasher_).privat._H6.block_mask_;
        bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x24);
        puVar8[uVar45] = uVar4 + 1;
        puVar23[(ulong)(uVar37 & uVar4) + (ulong)(uint)((int)uVar51 << (bVar30 & 0x1f))] =
             uVar35 - 3;
        bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x24);
        uVar51 = (*(ulong *)(data + (uVar35 - 2 & uVar5)) & uVar26) * 0x1fe35a7bd3579bd3 >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
        uVar45 = uVar51 & 0xffffffff;
        uVar4 = puVar8[uVar45];
        uVar37 = (s->hasher_).privat._H6.block_mask_;
        puVar8[uVar45] = uVar4 + 1;
        puVar23[(ulong)(uVar37 & uVar4) + (ulong)(uint)((int)uVar51 << (bVar30 & 0x1f))] =
             uVar35 - 2;
        bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x24);
        uVar26 = (uVar26 & *(ulong *)(data + (uVar35 - 1 & uVar5))) * 0x1fe35a7bd3579bd3 >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
        uVar51 = uVar26 & 0xffffffff;
        uVar4 = puVar8[uVar51];
        uVar37 = (s->hasher_).privat._H6.block_mask_;
        puVar8[uVar51] = uVar4 + 1;
        puVar23[(ulong)(uVar37 & uVar4) + (ulong)(uint)((int)uVar26 << (bVar30 & 0x1f))] =
             uVar35 - 1;
      }
      break;
    case 10:
      if ((2 < uVar7) && (0x7f < uVar32)) {
        puVar40 = (undefined1 *)((long)local_220 - 0x7f);
        local_1d8 = (size_t *)((long)local_220 + (uVar26 - 0x7f));
        if (local_220 < local_1d8) {
          local_1d8 = local_220;
        }
        if (puVar40 < local_1d8) {
          uVar26 = (s->hasher_).privat._H5.bucket_size_;
          local_1a8 = (s->hasher_).privat._H2.buckets_;
          pHVar9 = (s->hasher_).privat._H40.common;
          do {
            uVar51 = (long)local_220 - (long)puVar40;
            if (uVar51 < 0x10) {
              uVar51 = 0xf;
            }
            uVar37 = (uint)puVar40 & uVar5;
            uVar35 = (uint)(*(int *)(data + uVar37) * 0x1e35a7bd) >> 0xf;
            puVar52 = (undefined1 *)(ulong)local_1a8[uVar35];
            local_210 = (BlockSplitFromDecoder *)((uVar26 & (ulong)puVar40) * 2 + 1);
            local_248 = (uVar26 & (ulong)puVar40) * 2;
            local_1a8[uVar35] = (uint)puVar40;
            if (puVar40 != puVar52) {
              local_1c8 = (ContextLut)(uVar26 - uVar51);
              local_1e8 = data + uVar37;
              lVar36 = 0x40;
              local_228 = 0;
              uVar51 = 0;
LAB_00130de0:
              bVar54 = lVar36 != 0;
              lVar36 = lVar36 + -1;
              local_1f0 = puVar40;
              if (((ulong)((long)puVar40 - (long)puVar52) <= local_1c8) && (bVar54)) {
                uVar35 = (uint)puVar52;
                uVar45 = uVar51;
                if (local_228 < uVar51) {
                  uVar45 = local_228;
                }
                puVar24 = data + uVar45 + (uVar35 & uVar5);
                uVar44 = 0x80 - uVar45;
                if (7 < uVar44) {
                  uVar43 = uVar44 & 0xfffffffffffffff8;
                  lVar47 = 0;
                  uVar49 = 0;
LAB_00130e58:
                  if (*(ulong *)(puVar24 + uVar49 * 8) ==
                      *(ulong *)(local_1e8 + uVar49 * 8 + uVar45)) goto code_r0x00130e65;
                  uVar43 = *(ulong *)(local_1e8 + uVar49 * 8 + uVar45) ^
                           *(ulong *)(puVar24 + uVar49 * 8);
                  uVar44 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar49 = (uVar44 >> 3 & 0x1fffffff) - lVar47;
                  goto LAB_00130ec4;
                }
                uVar43 = 0;
                goto LAB_00130f39;
              }
            }
LAB_00130d72:
            iVar22 = (s->hasher_).privat._H5.hash_shift_;
            *(int *)((long)&pHVar9->extra + local_248 * 4) = iVar22;
LAB_00130d87:
            *(int *)((long)&pHVar9->extra + (long)local_210 * 4) = iVar22;
            puVar40 = puVar40 + 1;
          } while ((size_t *)puVar40 != local_1d8);
        }
      }
    }
  }
  else {
    psVar41 = local_220;
    if (iVar22 < 0x36) {
      switch(iVar22) {
      case 0x23:
        if ((6 < uVar7) && (2 < uVar32)) {
          uVar37 = uVar35 - 3;
          puVar23 = (s->hasher_).privat._H2.buckets_;
          puVar23[(uint)(ushort)((ulong)(*(long *)(data + (uVar37 & uVar5)) * -0x42e1ca5843000000)
                                >> 0x30) + (uVar37 & 8) & 0xffff] = uVar37;
          uVar37 = uVar35 - 2;
          puVar23[(uint)(ushort)((ulong)(*(long *)(data + (uVar37 & uVar5)) * -0x42e1ca5843000000)
                                >> 0x30) + (uVar37 & 8) & 0xffff] = uVar37;
          uVar35 = uVar35 - 1;
          puVar23[(uint)(ushort)((ulong)(*(long *)(data + (uVar35 & uVar5)) * -0x42e1ca5843000000)
                                >> 0x30) + (uVar35 & 8) & 0xffff] = uVar35;
        }
        if (((ulong)local_220 & 3) != 0) {
          uVar51 = 4 - ((ulong)local_220 & 3);
          bVar54 = uVar26 < uVar51;
          uVar26 = uVar26 - uVar51;
          if (bVar54) {
            uVar26 = 0;
          }
          psVar41 = (size_t *)((long)local_220 + uVar51);
        }
        uVar45 = (ulong)((uint)psVar41 & uVar5);
        uVar51 = mask - uVar45;
        if (uVar26 < uVar51) {
          uVar51 = uVar26;
        }
        if (0x1f < uVar51) {
          iVar22 = 0;
          uVar26 = 0xfffffffffffffffc;
          do {
            iVar22 = iVar22 * (s->hasher_).privat._H35.hb.factor + (uint)data[uVar26 + uVar45 + 4] +
                     1;
            uVar26 = uVar26 + 4;
          } while (uVar26 < 0x1c);
LAB_001314c4:
          (s->hasher_).privat._H5.hash_shift_ = iVar22;
        }
LAB_001314cb:
        *(size_t **)&(s->hasher_).privat._H65.ha.block_mask_ = psVar41;
        break;
      case 0x28:
      case 0x29:
        if ((2 < uVar7) && (2 < uVar32)) {
          puVar40 = (undefined1 *)((long)local_220 - 3);
          pvVar28 = (s->hasher_).privat._H40.extra;
          uVar35 = (uint)(*(int *)(data + ((uint)puVar40 & uVar5)) * 0x1e35a7bd) >> 0x11;
          uVar26 = (ulong)uVar35;
          uVar4 = (s->hasher_).privat._H42.free_slot_idx[0];
          (s->hasher_).privat._H42.free_slot_idx[0] = uVar4 + 1;
          uVar51 = (long)puVar40 - (ulong)*(uint *)((long)pvVar28 + uVar26 * 4);
          *(char *)((long)pvVar28 + ((ulong)puVar40 & 0xffff) + 0x30000) = (char)uVar35;
          if (0xfffe < uVar51) {
            uVar51 = 0xffff;
          }
          *(short *)((long)pvVar28 + (ulong)uVar4 * 4 + 0x40000) = (short)uVar51;
          *(undefined2 *)((long)pvVar28 + (ulong)uVar4 * 4 + 0x40002) =
               *(undefined2 *)((long)pvVar28 + uVar26 * 2 + 0x20000);
          *(uint *)((long)pvVar28 + uVar26 * 4) = (uint)puVar40;
          *(ushort *)((long)pvVar28 + uVar26 * 2 + 0x20000) = uVar4;
          puVar40 = (undefined1 *)((long)local_220 - 2);
          pvVar28 = (s->hasher_).privat._H40.extra;
          uVar35 = (uint)(*(int *)(data + ((uint)puVar40 & uVar5)) * 0x1e35a7bd) >> 0x11;
          uVar26 = (ulong)uVar35;
          uVar4 = (s->hasher_).privat._H42.free_slot_idx[0];
          (s->hasher_).privat._H42.free_slot_idx[0] = uVar4 + 1;
          uVar51 = (long)puVar40 - (ulong)*(uint *)((long)pvVar28 + uVar26 * 4);
          *(char *)((long)pvVar28 + ((ulong)puVar40 & 0xffff) + 0x30000) = (char)uVar35;
          if (0xfffe < uVar51) {
            uVar51 = 0xffff;
          }
          *(short *)((long)pvVar28 + (ulong)uVar4 * 4 + 0x40000) = (short)uVar51;
          *(undefined2 *)((long)pvVar28 + (ulong)uVar4 * 4 + 0x40002) =
               *(undefined2 *)((long)pvVar28 + uVar26 * 2 + 0x20000);
          *(uint *)((long)pvVar28 + uVar26 * 4) = (uint)puVar40;
          *(ushort *)((long)pvVar28 + uVar26 * 2 + 0x20000) = uVar4;
          puVar40 = (undefined1 *)((long)local_220 - 1);
          pvVar28 = (s->hasher_).privat._H40.extra;
          uVar35 = (uint)(*(int *)(data + ((uint)puVar40 & uVar5)) * 0x1e35a7bd) >> 0x11;
          uVar26 = (ulong)uVar35;
          uVar4 = (s->hasher_).privat._H42.free_slot_idx[0];
          (s->hasher_).privat._H42.free_slot_idx[0] = uVar4 + 1;
          uVar51 = (long)puVar40 - (ulong)*(uint *)((long)pvVar28 + uVar26 * 4);
          *(char *)((long)pvVar28 + ((ulong)puVar40 & 0xffff) + 0x30000) = (char)uVar35;
          if (0xfffe < uVar51) {
            uVar51 = 0xffff;
          }
          *(short *)((long)pvVar28 + (ulong)uVar4 * 4 + 0x40000) = (short)uVar51;
          *(undefined2 *)((long)pvVar28 + (ulong)uVar4 * 4 + 0x40002) =
               *(undefined2 *)((long)pvVar28 + uVar26 * 2 + 0x20000);
          *(uint *)((long)pvVar28 + uVar26 * 4) = (uint)puVar40;
          *(ushort *)((long)pvVar28 + uVar26 * 2 + 0x20000) = uVar4;
        }
        break;
      case 0x2a:
        if ((2 < uVar7) && (2 < uVar32)) {
          puVar40 = (undefined1 *)((long)local_220 - 3);
          pvVar28 = (s->hasher_).privat._H42.extra;
          uVar37 = (uint)(*(int *)(data + ((uint)puVar40 & uVar5)) * 0x1e35a7bd) >> 0x11;
          uVar26 = (ulong)uVar37;
          uVar35 = uVar37 & 0x1ff;
          uVar4 = *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar35 * 2 + 0x58);
          *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar35 * 2 + 0x58) = uVar4 + 1;
          uVar51 = (ulong)uVar4 & 0x1ff;
          uVar45 = (long)puVar40 - (ulong)*(uint *)((long)pvVar28 + uVar26 * 4);
          if (0xfffe < uVar45) {
            uVar45 = 0xffff;
          }
          *(char *)((long)pvVar28 + ((ulong)puVar40 & 0xffff) + 0x30000) = (char)uVar37;
          *(short *)((long)pvVar28 + uVar51 * 4 + (ulong)(uVar35 << 0xb) + 0x40000) = (short)uVar45;
          *(undefined2 *)((long)pvVar28 + uVar51 * 4 + (ulong)(uVar35 << 0xb) + 0x40002) =
               *(undefined2 *)((long)pvVar28 + uVar26 * 2 + 0x20000);
          *(uint *)((long)pvVar28 + uVar26 * 4) = (uint)puVar40;
          *(short *)((long)pvVar28 + uVar26 * 2 + 0x20000) = (short)uVar51;
          puVar40 = (undefined1 *)((long)local_220 - 2);
          pvVar28 = (s->hasher_).privat._H42.extra;
          uVar35 = (uint)(*(int *)(data + ((uint)puVar40 & uVar5)) * 0x1e35a7bd) >> 0x11;
          uVar51 = (ulong)uVar35;
          uVar37 = uVar35 & 0x1ff;
          uVar4 = *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar37 * 2 + 0x58);
          *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar37 * 2 + 0x58) = uVar4 + 1;
          uVar45 = (ulong)uVar4 & 0x1ff;
          uVar26 = (long)puVar40 - (ulong)*(uint *)((long)pvVar28 + uVar51 * 4);
          *(char *)((long)pvVar28 + ((ulong)puVar40 & 0xffff) + 0x30000) = (char)uVar35;
          if (0xfffe < uVar26) {
            uVar26 = 0xffff;
          }
          *(short *)((long)pvVar28 + uVar45 * 4 + (ulong)(uVar37 << 0xb) + 0x40000) = (short)uVar26;
          *(undefined2 *)((long)pvVar28 + uVar45 * 4 + (ulong)(uVar37 << 0xb) + 0x40002) =
               *(undefined2 *)((long)pvVar28 + uVar51 * 2 + 0x20000);
          *(uint *)((long)pvVar28 + uVar51 * 4) = (uint)puVar40;
          *(short *)((long)pvVar28 + uVar51 * 2 + 0x20000) = (short)uVar45;
          puVar40 = (undefined1 *)((long)local_220 - 1);
          pvVar28 = (s->hasher_).privat._H42.extra;
          uVar37 = (uint)(*(int *)(data + ((uint)puVar40 & uVar5)) * 0x1e35a7bd) >> 0x11;
          uVar26 = (ulong)uVar37;
          uVar35 = uVar37 & 0x1ff;
          uVar4 = *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar35 * 2 + 0x58);
          *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar35 * 2 + 0x58) = uVar4 + 1;
          uVar51 = (ulong)uVar4 & 0x1ff;
          uVar45 = (long)puVar40 - (ulong)*(uint *)((long)pvVar28 + uVar26 * 4);
          *(char *)((long)pvVar28 + ((ulong)puVar40 & 0xffff) + 0x30000) = (char)uVar37;
          if (0xfffe < uVar45) {
            uVar45 = 0xffff;
          }
          *(short *)((long)pvVar28 + uVar51 * 4 + (ulong)(uVar35 << 0xb) + 0x40000) = (short)uVar45;
          *(undefined2 *)((long)pvVar28 + uVar51 * 4 + (ulong)(uVar35 << 0xb) + 0x40002) =
               *(undefined2 *)((long)pvVar28 + uVar26 * 2 + 0x20000);
          *(uint *)((long)pvVar28 + uVar26 * 4) = (uint)puVar40;
          *(short *)((long)pvVar28 + uVar26 * 2 + 0x20000) = (short)uVar51;
        }
      }
    }
    else if (iVar22 == 0x36) {
      if ((6 < uVar7) && (2 < uVar32)) {
        uVar37 = uVar35 - 3;
        puVar23 = (s->hasher_).privat._H2.buckets_;
        uVar34 = 0xfffff;
        puVar23[(uint)((ulong)(*(long *)(data + (uVar37 & uVar5)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                (uVar37 & 0x18) & 0xfffff] = uVar37;
        uVar37 = uVar35 - 2;
        puVar23[(uint)((ulong)(*(long *)(data + (uVar37 & uVar5)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                (uVar37 & 0x18) & 0xfffff] = uVar37;
        uVar37 = (uint)((ulong)(*(long *)(data + (uVar35 - 1 & uVar5)) * 0x35a7bd1e35a7bd00) >> 0x2c
                       );
        goto LAB_001313d3;
      }
    }
    else {
      if (iVar22 == 0x37) {
        if ((6 < uVar7) && (2 < uVar32)) {
          uVar37 = uVar35 - 3;
          puVar23 = (s->hasher_).privat._H2.buckets_;
          puVar23[(uint)((ulong)(*(long *)(data + (uVar37 & uVar5)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                  (uVar37 & 0x18) & 0xfffff] = uVar37;
          uVar37 = uVar35 - 2;
          puVar23[(uint)((ulong)(*(long *)(data + (uVar37 & uVar5)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                  (uVar37 & 0x18) & 0xfffff] = uVar37;
          uVar35 = uVar35 - 1;
          puVar23[(uint)((ulong)(*(long *)(data + (uVar35 & uVar5)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                  (uVar35 & 0x18) & 0xfffff] = uVar35;
        }
        if (((ulong)local_220 & 3) != 0) {
          uVar51 = 4 - ((ulong)local_220 & 3);
          bVar54 = uVar26 < uVar51;
          uVar26 = uVar26 - uVar51;
          if (bVar54) {
            uVar26 = 0;
          }
          psVar41 = (size_t *)((long)local_220 + uVar51);
        }
        uVar45 = (ulong)((uint)psVar41 & uVar5);
        uVar51 = mask - uVar45;
        if (uVar26 < uVar51) {
          uVar51 = uVar26;
        }
        if (0x1f < uVar51) {
          iVar22 = 0;
          uVar26 = 0xfffffffffffffffc;
          do {
            iVar22 = iVar22 * (s->hasher_).privat._H35.hb.factor + (uint)data[uVar26 + uVar45 + 4] +
                     1;
            uVar26 = uVar26 + 4;
          } while (uVar26 < 0x1c);
          goto LAB_001314c4;
        }
        goto LAB_001314cb;
      }
      if (iVar22 == 0x41) {
        if ((6 < uVar7) && (2 < uVar32)) {
          uVar51 = (s->hasher_).privat._H6.hash_mask_;
          uVar45 = (*(ulong *)(data + (uVar35 - 3 & uVar5)) & uVar51) * 0x1fe35a7bd3579bd3 >>
                   (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
          puVar8 = (s->hasher_).privat._H6.num_;
          puVar23 = (s->hasher_).privat._H6.buckets_;
          uVar44 = uVar45 & 0xffffffff;
          uVar4 = puVar8[uVar44];
          uVar37 = (s->hasher_).privat._H6.block_mask_;
          bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x24);
          puVar8[uVar44] = uVar4 + 1;
          puVar23[(ulong)(uVar37 & uVar4) + (ulong)(uint)((int)uVar45 << (bVar30 & 0x1f))] =
               uVar35 - 3;
          bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x24);
          uVar45 = (*(ulong *)(data + (uVar35 - 2 & uVar5)) & uVar51) * 0x1fe35a7bd3579bd3 >>
                   (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
          uVar44 = uVar45 & 0xffffffff;
          uVar4 = puVar8[uVar44];
          uVar37 = (s->hasher_).privat._H6.block_mask_;
          puVar8[uVar44] = uVar4 + 1;
          puVar23[(ulong)(uVar37 & uVar4) + (ulong)(uint)((int)uVar45 << (bVar30 & 0x1f))] =
               uVar35 - 2;
          bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x24);
          uVar51 = (uVar51 & *(ulong *)(data + (uVar35 - 1 & uVar5))) * 0x1fe35a7bd3579bd3 >>
                   (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
          uVar45 = uVar51 & 0xffffffff;
          uVar4 = puVar8[uVar45];
          uVar37 = (s->hasher_).privat._H6.block_mask_;
          puVar8[uVar45] = uVar4 + 1;
          puVar23[(ulong)(uVar37 & uVar4) + (ulong)(uint)((int)uVar51 << (bVar30 & 0x1f))] =
               uVar35 - 1;
        }
        uVar51 = mask - (uVar5 & uVar35);
        if (uVar26 <= uVar51) {
          uVar51 = uVar26;
        }
        if (0x1f < (uint)uVar51) {
          lVar36 = 0;
          uVar42 = 0;
          do {
            uVar42 = uVar42 * (s->hasher_).privat._H65.hb.factor +
                     (uint)data[lVar36 + (ulong)(uVar5 & uVar35)] + 1;
            lVar36 = lVar36 + 1;
          } while (lVar36 != 0x20);
          (s->hasher_).privat._H65.hb.state = uVar42;
        }
        *(size_t **)((long)&(s->hasher_).privat + 0x58) = local_220;
      }
    }
  }
  uVar26 = s->last_flush_pos_;
  uVar35 = (uint)uVar26;
  if (0xbfffffff < uVar26) {
    uVar35 = ((int)(uVar35 * 2) >> 1 & 0xc0000000U) + (uVar35 & 0x3fffffff) + 0x80000000;
  }
  psVar41 = &s->num_commands_;
  if (((s->params).quality < 10) ||
     (iVar22 = BrotliIsMostlyUTF8(data,(ulong)uVar35,mask,s->input_pos_ - uVar26,0.75), iVar22 != 0)
     ) {
    uVar26 = 2;
  }
  else {
    uVar26 = 3;
  }
  sVar38 = *psVar41;
  if ((sVar38 != 0) && (s->last_insert_len_ == 0)) {
    pCVar27 = s->commands_;
    uVar45 = (1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10;
    uVar35 = pCVar27[sVar38 - 1].copy_len_;
    uVar37 = uVar35 & 0x1ffffff;
    uVar51 = s->last_processed_pos_ - (ulong)uVar37;
    if (uVar45 <= uVar51) {
      uVar51 = uVar45;
    }
    iVar22 = s->dist_cache_[0];
    uVar4 = pCVar27[sVar38 - 1].dist_prefix_;
    uVar50 = uVar4 & 0x3ff;
    uVar42 = (s->params).dist.num_direct_distance_codes;
    uVar34 = uVar42 + 0x10;
    local_208 = (BlockSplitFromDecoder *)CONCAT44(local_208._4_4_,(uint)uVar4);
    if (uVar34 <= uVar50) {
      uVar6 = (s->params).dist.distance_postfix_bits;
      bVar30 = (byte)uVar6;
      uVar50 = (uVar50 - uVar42) - 0x10;
      uVar50 = (~(-1 << (bVar30 & 0x1f)) & uVar50) + uVar34 +
               (pCVar27[sVar38 - 1].dist_extra_ +
                (((uVar50 >> (uVar6 & 0x1f) & 1) != 0) + 2 << ((byte)(uVar4 >> 10) & 0x1f)) + -4 <<
               (bVar30 & 0x1f));
    }
    local_228 = uVar26;
    if ((ulong)(uVar50 - 0xf) == (long)iVar22 || uVar50 < 0x10) {
      if ((ulong)(long)iVar22 <= uVar51) {
        if (uVar7 == 0) {
          local_260 = 0;
        }
        else {
          uVar7 = (s->ringbuffer_).mask_;
          puVar24 = (s->ringbuffer_).buffer_;
          do {
            uVar37 = (uint)psVar53;
            if (puVar24[uVar37 & uVar7] != puVar24[uVar37 - iVar22 & uVar7]) goto LAB_001316fc;
            uVar35 = uVar35 + 1;
            pCVar27[sVar38 - 1].copy_len_ = uVar35;
            psVar53 = (size_t *)(ulong)(uVar37 + 1);
            uVar37 = (int)local_260 - 1;
            local_260 = (ulong)uVar37;
          } while (uVar37 != 0);
          local_260 = 0;
          psVar53 = (size_t *)(ulong)(((int)local_200 + uVar32) - uVar46);
LAB_001316fc:
          uVar37 = uVar35 & 0x1ffffff;
        }
      }
      uVar46 = pCVar27[sVar38 - 1].insert_len_;
      uVar37 = (uVar35 >> 0x19) + uVar37;
      uVar32 = uVar46;
      if (5 < (ulong)uVar46) {
        if (uVar46 < 0x82) {
          uVar51 = (ulong)uVar46 - 2;
          uVar46 = 0x1f;
          uVar32 = (uint)uVar51;
          if (uVar32 != 0) {
            for (; uVar32 >> uVar46 == 0; uVar46 = uVar46 - 1) {
            }
          }
          uVar32 = (int)(uVar51 >> ((char)(uVar46 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar46 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar46 < 0x842) {
          uVar32 = 0x1f;
          if (uVar46 - 0x42 != 0) {
            for (; uVar46 - 0x42 >> uVar32 == 0; uVar32 = uVar32 - 1) {
            }
          }
          uVar32 = (uVar32 ^ 0xffe0) + 0x2a;
        }
        else {
          uVar32 = 0x15;
          if (0x1841 < uVar46) {
            uVar32 = (uint)(ushort)(0x17 - (uVar46 < 0x5842));
          }
        }
      }
      if (uVar37 < 10) {
        uVar46 = uVar37 - 2;
      }
      else if (uVar37 < 0x86) {
        uVar46 = 0x1f;
        uVar35 = (uint)((ulong)uVar37 - 6);
        if (uVar35 != 0) {
          for (; uVar35 >> uVar46 == 0; uVar46 = uVar46 - 1) {
          }
        }
        uVar46 = (int)((ulong)uVar37 - 6 >> ((char)(uVar46 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar46 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar46 = 0x17;
        if (uVar37 < 0x846) {
          uVar46 = 0x1f;
          if (uVar37 - 0x46 != 0) {
            for (; uVar37 - 0x46 >> uVar46 == 0; uVar46 = uVar46 - 1) {
            }
          }
          uVar46 = (uVar46 ^ 0xffe0) + 0x2c;
        }
      }
      uVar18 = (ushort)uVar46;
      uVar33 = (uVar18 & 7) + ((ushort)uVar32 & 7) * 8;
      if ((((uVar4 & 0x3ff) == 0) && ((ushort)uVar32 < 8)) && (uVar18 < 0x10)) {
        if (7 < uVar18) {
          uVar33 = uVar33 + 0x40;
        }
      }
      else {
        iVar22 = ((uVar32 & 0xffff) >> 3) * 3 + ((uVar46 & 0xffff) >> 3);
        uVar33 = uVar33 + ((ushort)(0x520d40 >> ((char)iVar22 * '\x02' & 0x1fU)) & 0xc0) +
                          (short)iVar22 * 0x40 + 0x40;
      }
      pCVar27[sVar38 - 1].cmd_prefix_ = uVar33;
    }
  }
  literal_context_lut = "" + (uint)((int)uVar26 << 9);
  iVar22 = (s->params).quality;
  local_260 = local_260 & 0xffffffff;
  piVar25 = s->dist_cache_;
  last_insert_len = &s->last_insert_len_;
  pCVar27 = s->commands_ + sVar38;
  num_literals = &s->num_literals_;
  if (iVar22 == 0xb) {
    BrotliCreateHqZopfliBackwardReferences
              (m,local_260,(size_t)psVar53,data,mask,literal_context_lut,&s->params,hasher,piVar25,
               last_insert_len,pCVar27,psVar41,num_literals);
  }
  else if (iVar22 == 10) {
    BrotliCreateZopfliBackwardReferences
              (m,local_260,(size_t)psVar53,data,mask,literal_context_lut,&s->params,hasher,piVar25,
               last_insert_len,pCVar27,psVar41,num_literals);
  }
  else {
    BrotliCreateBackwardReferences
              (local_260,(size_t)psVar53,data,mask,literal_context_lut,&s->params,hasher,piVar25,
               last_insert_len,pCVar27,psVar41,num_literals,s->backward_references_,
               &s->back_refs_position_,s->back_refs_size_);
  }
  iVar22 = (s->params).lgwin;
  iVar21 = (s->params).lgblock;
  if (iVar22 <= iVar21) {
    iVar22 = iVar21;
  }
  cVar31 = '\x17';
  if (iVar22 < 0x17) {
    cVar31 = (char)iVar22;
  }
  uVar51 = 1L << (cVar31 + 1U & 0x3f);
  uVar10 = s->input_pos_;
  uVar11 = s->last_flush_pos_;
  if ((s->params).quality < 4) {
    bVar54 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar54 = false;
  }
  uVar45 = uVar10 - uVar11;
  if ((((int)local_218 == 0 && is_last == 0) && (!bVar54)) &&
     (((1L << ((byte)iVar21 & 0x3f)) + uVar45 <= uVar51 &&
      ((uVar51 = uVar51 >> 3, s->num_literals_ < uVar51 && (*psVar41 < uVar51)))))) {
    iVar22 = UpdateLastProcessedPos(s);
    if (iVar22 != 0) {
      *local_1f8 = 0;
    }
LAB_00131b4c:
    *local_1e0 = 0;
    return 1;
  }
  uVar51 = s->last_insert_len_;
  if (uVar51 != 0) {
    pCVar27 = s->commands_;
    sVar38 = s->num_commands_;
    s->num_commands_ = sVar38 + 1;
    pCVar27[sVar38].insert_len_ = (uint32_t)uVar51;
    pCVar27[sVar38].copy_len_ = 0x8000000;
    pCVar27[sVar38].dist_extra_ = 0;
    pCVar27[sVar38].dist_prefix_ = 0x10;
    if (uVar51 < 6) {
      uVar44 = uVar51 & 0xffffffff;
    }
    else if (uVar51 < 0x82) {
      uVar46 = 0x1f;
      uVar32 = (uint)(uVar51 - 2);
      if (uVar32 != 0) {
        for (; uVar32 >> uVar46 == 0; uVar46 = uVar46 - 1) {
        }
      }
      uVar44 = (ulong)((int)(uVar51 - 2 >> ((char)(uVar46 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar46 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar51 < 0x842) {
      uVar32 = (uint32_t)uVar51 - 0x42;
      uVar46 = 0x1f;
      if (uVar32 != 0) {
        for (; uVar32 >> uVar46 == 0; uVar46 = uVar46 - 1) {
        }
      }
      uVar44 = (ulong)((uVar46 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar44 = 0x15;
      if (0x1841 < uVar51) {
        uVar44 = (ulong)(ushort)(0x17 - (uVar51 < 0x5842));
      }
    }
    iVar22 = (int)((uVar44 & 0xffff) >> 3) * 3;
    pCVar27[sVar38].cmd_prefix_ =
         ((ushort)(0x520d40 >> ((char)iVar22 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar22 * 0x40 +
         ((ushort)uVar44 & 7) * 8 + 0x42;
    s->num_literals_ = s->num_literals_ + uVar51;
    s->last_insert_len_ = 0;
  }
  if (uVar10 == uVar11 && is_last == 0) goto LAB_00131b4c;
  puVar24 = GetBrotliStorage(s,(ulong)((int)uVar45 * 2 + 0x1f7));
  storage_ix_1 = (size_t)s->last_bytes_bits_;
  *puVar24 = (uint8_t)s->last_bytes_;
  puVar24[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  uVar51 = s->last_flush_pos_;
  uVar45 = uVar45 & 0xffffffff;
  uVar46 = (uint)uVar51;
  if (0xbfffffff < uVar51) {
    uVar46 = (uVar46 & 0x3fffffff) + ((int)(uVar46 * 2) >> 1 & 0xc0000000U) + 0x80000000;
  }
  prev_byte = s->prev_byte_;
  local_218 = CONCAT71(local_218._1_7_,s->prev_byte2_);
  sVar38 = s->num_literals_;
  pCVar27 = s->commands_;
  num_commands = s->num_commands_;
  piVar2 = s->saved_dist_cache_;
  local_208 = s->literals_block_splits_decoder_;
  local_210 = s->cmds_block_splits_decoder_;
  local_200 = storage_ix_1;
  local_1c8 = literal_context_lut;
  memcpy(&table_size,s,0x90);
  if (uVar45 == 0) {
    uVar26 = local_200 >> 3 & 0x1fffffff;
    *(ulong *)(puVar24 + uVar26) = 3L << ((byte)local_200 & 7) | (ulong)puVar24[uVar26];
    storage_ix_1 = (size_t)((int)local_200 + 9U & 0xfffffff8);
  }
  else {
    local_228 = uVar26;
    iVar22 = ShouldCompress(data,mask,uVar51,uVar45,sVar38,num_commands);
    if (iVar22 == 0) {
      uVar13 = *(undefined8 *)(s->saved_dist_cache_ + 2);
      *(undefined8 *)piVar25 = *(undefined8 *)piVar2;
      *(undefined8 *)(s->dist_cache_ + 2) = uVar13;
    }
    else {
      local_1e8 = (uint8_t *)CONCAT71(local_1e8._1_7_,*puVar24);
      uVar39 = puVar24[1];
      iVar22 = (s->params).quality;
      if (iVar22 < 3) {
        BrotliStoreMetaBlockFast
                  (m,data,(ulong)uVar46,uVar45,mask,is_last,&s->params,pCVar27,num_commands,
                   &storage_ix_1,puVar24);
      }
      else if (iVar22 == 3) {
        BrotliStoreMetaBlockTrivial
                  (m,data,(ulong)uVar46,uVar45,mask,is_last,&s->params,pCVar27,num_commands,
                   &storage_ix_1,puVar24);
      }
      else {
        local_1f0 = (undefined1 *)CONCAT71(local_1f0._1_7_,uVar39);
        psVar53 = &s->current_block_cmds_;
        BrotliInitBlockSplit((BlockSplit *)&storage_ix);
        BrotliInitBlockSplit(&local_170);
        BrotliInitBlockSplit(&local_140);
        local_d0 = (undefined1  [16])0x0;
        local_e0 = (undefined1  [16])0x0;
        local_f0 = (undefined1  [16])0x0;
        local_100 = (undefined1  [16])0x0;
        local_110 = (undefined1  [16])0x0;
        iVar22 = (s->params).quality;
        uVar26 = (ulong)uVar46;
        uVar39 = (uint8_t)local_218;
        local_220 = (size_t *)(local_218 & 0xff);
        local_218 = uVar26;
        if (iVar22 < 10) {
          num_literal_contexts = 1;
          local_1b8 = (uint32_t *)0x0;
          local_1d8 = psVar53;
          if ((s->params).disable_literal_context_modeling == 0) {
            DecideOverLiteralContextModeling
                      (data,uVar26,uVar45,mask,iVar22,(s->params).size_hint,&num_literal_contexts,
                       &local_1b8);
          }
          BrotliBuildMetaBlockGreedy
                    (m,data,local_218,mask,prev_byte,uVar39,local_1c8,num_literal_contexts,local_1b8
                     ,pCVar27,num_commands,local_208,&s->current_block_literals_,local_210,local_1d8
                     ,(MetaBlockSplit *)&storage_ix);
        }
        else {
          BrotliBuildMetaBlock
                    (m,data,uVar26,mask,(BrotliEncoderParams *)&table_size,prev_byte,uVar39,pCVar27,
                     num_commands,(ContextType)local_228,local_208,&s->current_block_literals_,
                     local_210,psVar53,(MetaBlockSplit *)&storage_ix);
        }
        if (3 < (s->params).quality) {
          BrotliOptimizeHistograms(local_74,(MetaBlockSplit *)&storage_ix);
        }
        BrotliStoreMetaBlock
                  (m,data,local_218,uVar45,mask,prev_byte,(uint8_t)local_220,is_last,
                   (BrotliEncoderParams *)&table_size,(ContextType)local_228,pCVar27,num_commands,
                   (MetaBlockSplit *)&storage_ix,&storage_ix_1,puVar24);
        BrotliDestroyBlockSplit(m,(BlockSplit *)&storage_ix);
        BrotliDestroyBlockSplit(m,&local_170);
        BrotliDestroyBlockSplit(m,&local_140);
        BrotliFree(m,(void *)local_110._0_8_);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_110._8_8_;
        local_110 = auVar14 << 0x40;
        BrotliFree(m,(void *)local_100._0_8_);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_100._8_8_;
        local_100 = auVar15 << 0x40;
        BrotliFree(m,(void *)local_f0._0_8_);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_f0._8_8_;
        local_f0 = auVar16 << 0x40;
        BrotliFree(m,(void *)local_e0._0_8_);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_e0._8_8_;
        local_e0 = auVar17 << 0x40;
        BrotliFree(m,(void *)local_d0._0_8_);
        uVar39 = (uint8_t)local_1f0;
      }
      if (storage_ix_1 >> 3 <= uVar45 + 4) goto LAB_001320db;
      uVar13 = *(undefined8 *)(s->saved_dist_cache_ + 2);
      *(undefined8 *)piVar25 = *(undefined8 *)piVar2;
      *(undefined8 *)(s->dist_cache_ + 2) = uVar13;
      *puVar24 = (uint8_t)local_1e8;
      puVar24[1] = uVar39;
      storage_ix_1 = local_200;
    }
    BrotliStoreUncompressedMetaBlock(is_last,data,(ulong)uVar46,mask,uVar45,&storage_ix_1,puVar24);
  }
LAB_001320db:
  sVar38 = storage_ix_1 >> 3;
  s->last_bytes_ = (ushort)puVar24[sVar38];
  s->last_bytes_bits_ = (byte)storage_ix_1 & 7;
  s->last_flush_pos_ = s->input_pos_;
  iVar22 = UpdateLastProcessedPos(s);
  if (iVar22 != 0) {
    *local_1f8 = 0;
  }
  uVar10 = s->last_flush_pos_;
  if (uVar10 != 0) {
    s->prev_byte_ = data[uVar5 & (int)uVar10 - 1U];
    if (uVar10 != 1) {
      s->prev_byte2_ = data[uVar5 & (int)uVar10 - 2U];
    }
  }
  s->num_commands_ = 0;
  s->num_literals_ = 0;
  uVar13 = *(undefined8 *)(s->dist_cache_ + 2);
  *(undefined8 *)piVar2 = *(undefined8 *)piVar25;
  *(undefined8 *)(s->saved_dist_cache_ + 2) = uVar13;
  *local_1d0 = puVar24;
LAB_00132194:
  *local_1e0 = sVar38;
  return 1;
code_r0x00130e65:
  uVar49 = uVar49 + 1;
  lVar47 = lVar47 + -8;
  if (uVar44 >> 3 == uVar49) goto code_r0x00130e71;
  goto LAB_00130e58;
code_r0x00130e71:
  puVar24 = puVar24 + -lVar47;
LAB_00130f39:
  uVar44 = uVar44 & 7;
  uVar49 = uVar43;
  if (uVar44 != 0) {
    uVar48 = uVar43 | uVar44;
    do {
      uVar49 = uVar43;
      local_1c0 = pHVar9;
      if (local_1e8[uVar43 + uVar45] != *puVar24) break;
      puVar24 = puVar24 + 1;
      uVar43 = uVar43 + 1;
      uVar44 = uVar44 - 1;
      uVar49 = uVar48;
    } while (uVar44 != 0);
  }
LAB_00130ec4:
  uVar49 = uVar49 + uVar45;
  local_208 = (BlockSplitFromDecoder *)uVar51;
  if (0x7f < uVar49) {
    *(undefined4 *)((long)&pHVar9->extra + local_248 * 4) =
         *(undefined4 *)(&pHVar9->extra + ((ulong)puVar52 & uVar26));
    iVar22 = *(int *)((long)&pHVar9->extra + ((ulong)puVar52 & uVar26) * 8 + 4);
    goto LAB_00130d87;
  }
  uVar45 = ((ulong)puVar52 & uVar26) * 2;
  if (data[uVar49 + (uVar35 & uVar5)] < local_1e8[uVar49]) {
    *(uint *)((long)&pHVar9->extra + local_248 * 4) = uVar35;
    uVar45 = uVar45 | 1;
    local_248 = uVar45;
    local_228 = uVar49;
  }
  else {
    *(uint *)((long)&pHVar9->extra + (long)local_210 * 4) = uVar35;
    uVar51 = uVar49;
    local_210 = (BlockSplitFromDecoder *)uVar45;
  }
  puVar52 = (undefined1 *)(ulong)*(uint *)((long)&pHVar9->extra + uVar45 * 4);
  if (puVar40 == puVar52) goto LAB_00130d72;
  goto LAB_00130de0;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;
  ContextLut literal_context_lut;

  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->command_buf_) ||
        BROTLI_IS_NULL(s->literal_buf_)) {
      return BROTLI_FALSE;
    }
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(new_commands)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));
  literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }
  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_, s->backward_references_,
        &s->back_refs_position_, s->back_refs_size_);
  }
  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(&s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage, s->literals_block_splits_decoder_,
        &s->current_block_literals_, s->cmds_block_splits_decoder_,
        &s->current_block_cmds_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(&s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}